

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O2

void m256v_multadd_row_from(m256v *M1,int r1,int offs,uint8_t alpha,m256v *Mt,int rt)

{
  uint8_t *puVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  undefined7 in_register_00000009;
  byte *pbVar7;
  long lVar8;
  uint8_t *puVar9;
  
  iVar6 = (int)CONCAT71(in_register_00000009,alpha);
  if (iVar6 != 0) {
    if (iVar6 == 1) {
      lVar8 = (long)r1 * M1->rstride;
      puVar9 = M1->e;
      pbVar5 = Mt->e + (long)offs + (long)rt * Mt->rstride;
      iVar6 = M1->n_col;
      for (pbVar7 = puVar9 + offs + lVar8; pbVar7 < puVar9 + iVar6 + lVar8; pbVar7 = pbVar7 + 1) {
        *pbVar5 = *pbVar5 ^ *pbVar7;
        pbVar5 = pbVar5 + 1;
      }
    }
    else {
      iVar3 = gf256_log(alpha);
      lVar8 = (long)r1 * M1->rstride;
      puVar1 = M1->e;
      pbVar7 = Mt->e + (long)offs + (long)rt * Mt->rstride;
      iVar6 = M1->n_col;
      for (puVar9 = puVar1 + offs + lVar8; puVar9 < puVar1 + iVar6 + lVar8; puVar9 = puVar9 + 1) {
        if (*puVar9 != '\0') {
          iVar4 = gf256_log(*puVar9);
          bVar2 = gf256_exp(iVar4 + iVar3);
          *pbVar7 = *pbVar7 ^ bVar2;
        }
        pbVar7 = pbVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void m256v_multadd_row_from(const m256v* M1,
			int r1,
			int offs,
			uint8_t alpha,
			m256v* Mt,
			int rt)
{
	assert (M1->n_col == Mt->n_col);

	if (alpha == 0)
		return;
	if (alpha == 1) {
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			*t++ ^= *s++;
		}
	} else {
		const int log_alpha = flog(alpha);
		uint8_t* s = M1->e + get_el_offs(M1, r1, offs);
		uint8_t* t = Mt->e + get_el_offs(Mt, rt, offs);
		uint8_t* end = M1->e + get_el_offs(M1, r1, M1->n_col);
		while (s < end) {
			/* Mt[rt, i] += exp(log_alpha + log(M1[r1, i]))
			 * if said logarithm is defined.
			 *
			 * Otherwise, M[rt, i] is unchanged.
			 */
			const uint8_t ve = *s++;
			if (ve != 0) {
				*t ^= fexp(log_alpha + flog(ve));
			}
			++t;
		}
	}
}